

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

int google::protobuf::compiler::java::GetExperimentalJavaFieldTypeForPacked(FieldDescriptor *field)

{
  Type TVar1;
  int iVar2;
  LogMessage *pLVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  TVar1 = FieldDescriptor::type(field);
  if ((int)TVar1 < 9) {
    iVar2 = TVar1 + 0x22;
  }
  else if (TVar1 < TYPE_UINT32) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x401);
    pLVar3 = internal::LogMessage::operator<<(&local_48,(string *)(*(long *)(field + 8) + 0x20));
    pLVar3 = internal::LogMessage::operator<<(pLVar3," can\'t be packed.");
    internal::LogFinisher::operator=(&local_49,pLVar3);
    internal::LogMessage::~LogMessage(&local_48);
    iVar2 = 0;
  }
  else {
    iVar2 = TVar1 + (TYPE_SFIXED64|TYPE_ENUM);
  }
  return iVar2;
}

Assistant:

int GetExperimentalJavaFieldTypeForPacked(const FieldDescriptor* field) {
  int result = field->type();
  if (result < FieldDescriptor::TYPE_STRING) {
    return result + 34;
  } else if (result > FieldDescriptor::TYPE_BYTES) {
    return result + 30;
  } else {
    GOOGLE_LOG(FATAL) << field->full_name() << " can't be packed.";
    return 0;
  }
}